

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O3

bool __thiscall banksia::WbEngine::isFeatureOn(WbEngine *this,string *featureName,bool defaultValue)

{
  int iVar1;
  iterator iVar2;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->featureMap)._M_t,featureName);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->featureMap)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = std::__cxx11::string::compare((char *)(iVar2._M_node + 2));
    defaultValue = iVar1 == 0;
  }
  return defaultValue;
}

Assistant:

bool WbEngine::isFeatureOn(const std::string& featureName, bool defaultValue)
{
    auto p = featureMap.find(featureName);
    return p == featureMap.end() ? defaultValue : p->second == "1";
}